

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

IfGenerateSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IfGenerateSyntax,slang::syntax::IfGenerateSyntax_const&>
          (BumpAllocator *this,IfGenerateSyntax *args)

{
  IfGenerateSyntax *pIVar1;
  IfGenerateSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pIVar1 = (IfGenerateSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::IfGenerateSyntax::IfGenerateSyntax(in_RSI,pIVar1);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }